

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O3

int __thiscall CFunctionTable::Insert(CFunctionTable *this,char *name_cstr,function_fn_t nfunp)

{
  _Alloc_hider _Var1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>_>,_bool>
  pVar5;
  string name;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  function_fn_t local_30;
  
  local_30 = nfunp;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name_cstr,&local_51);
  pVar5 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)()>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)()>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
          ::_M_emplace_unique<std::__cxx11::string&,void(*&)()>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)()>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)()>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
                      *)this,&local_50,&local_30);
  _Var1._M_p = local_50._M_dataplus._M_p;
  uVar3 = 0;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (local_50._M_string_length != 0) {
      sVar4 = 0;
      do {
        iVar2 = toupper((int)_Var1._M_p[sVar4]);
        _Var1._M_p[sVar4] = (char)iVar2;
        sVar4 = sVar4 + 1;
      } while (local_50._M_string_length != sVar4);
    }
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)()>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)()>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
            ::_M_emplace_unique<std::__cxx11::string&,void(*&)()>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)()>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)()>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
                        *)this,&local_50,&local_30);
    uVar3 = (uint)pVar5.second;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return uVar3;
}

Assistant:

int CFunctionTable::Insert(const char* name_cstr, function_fn_t nfunp) {
	std::string name(name_cstr);
	if (!std::get<1>(functions.emplace(name, nfunp))) return 0;
	for (auto& c : name) c = toupper(c);
	return std::get<1>(functions.emplace(name, nfunp));
}